

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_soup_mesh_builder.cc
# Opt level: O1

unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> __thiscall
draco::TriangleSoupMeshBuilder::Finalize(TriangleSoupMeshBuilder *this)

{
  long lVar1;
  char cVar2;
  pointer pcVar3;
  long lVar4;
  long *in_RSI;
  long lVar5;
  long lVar6;
  TriangleSoupMeshBuilder *pTVar7;
  
  cVar2 = (**(code **)(*(long *)in_RSI[3] + 0x20))();
  if (cVar2 == '\0') {
    pcVar3 = (pointer)0x0;
    pTVar7 = this;
  }
  else {
    pTVar7 = (TriangleSoupMeshBuilder *)(in_RSI + 3);
    (**(code **)(*(long *)in_RSI[3] + 0x28))();
    lVar1 = *in_RSI;
    lVar4 = in_RSI[1] - lVar1;
    if (lVar4 != 0) {
      pcVar3 = (pTVar7->attribute_element_types_).
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = 0;
      lVar6 = 0;
      do {
        cVar2 = *(char *)(lVar1 + lVar6);
        if (-1 < cVar2) {
          *(int *)(*(long *)(pcVar3 + 0xa8) + (lVar5 >> 0x1e)) = (int)cVar2;
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x100000000;
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar6);
    }
    pcVar3 = (pTVar7->attribute_element_types_).
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  (this->attribute_element_types_).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_start = pcVar3;
  (pTVar7->attribute_element_types_).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  return (__uniq_ptr_data<draco::Mesh,_std::default_delete<draco::Mesh>,_true,_true>)
         (__uniq_ptr_data<draco::Mesh,_std::default_delete<draco::Mesh>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Mesh> TriangleSoupMeshBuilder::Finalize() {
#ifdef DRACO_ATTRIBUTE_VALUES_DEDUPLICATION_SUPPORTED
  // First deduplicate attribute values.
  if (!mesh_->DeduplicateAttributeValues()) {
    return nullptr;
  }
#endif
#ifdef DRACO_ATTRIBUTE_INDICES_DEDUPLICATION_SUPPORTED
  // Also deduplicate vertex indices.
  mesh_->DeduplicatePointIds();
#endif
  for (size_t i = 0; i < attribute_element_types_.size(); ++i) {
    if (attribute_element_types_[i] >= 0) {
      mesh_->SetAttributeElementType(
          static_cast<int>(i),
          static_cast<MeshAttributeElementType>(attribute_element_types_[i]));
    }
  }
  return std::move(mesh_);
}